

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O1

value_type * __thiscall
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,test::UnsignedLargeEnumClass>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,UnsignedLargeEnumClass *in
          )

{
  uint *puVar1;
  long lVar2;
  string_view full_tag;
  string_view tag_00;
  InputStream istream;
  cx_string<86UL> tag;
  ToString visitor;
  stringstream stream;
  InputStream local_398;
  char local_38f [87];
  undefined8 local_338 [2];
  long local_328;
  uint auStack_310 [22];
  ios_base aiStack_2b8 [264];
  long local_1b0 [2];
  char local_1a0 [12];
  undefined4 auStack_194 [25];
  ios_base aiStack_130 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  lVar2 = *(long *)(local_1b0[0] + -0x18);
  *(undefined4 *)((long)auStack_194 + lVar2) = 4;
  std::ios::clear((int)local_38f + (int)lVar2 + 0x1df);
  local_338[0] = *(undefined8 *)this;
  std::ostream::write(local_1a0,(long)local_338);
  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
  puVar1 = (uint *)((long)auStack_310 + *(long *)(local_328 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_398.stream = (stringstream *)local_1b0;
  mserialize::CustomTag<test::UnsignedLargeEnumClass,_void>::tag_string();
  full_tag._len = 0x56;
  full_tag._ptr = local_38f;
  tag_00._len = 0x56;
  tag_00._ptr = local_38f;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_338,&local_398,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base(aiStack_2b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  return __return_storage_ptr__;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}